

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

int Abc_NtkDarDemiter(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Aig_Man_t *p;
  char *pcVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Aig_Man_t *pAVar5;
  Aig_Man_t *pPart1;
  Aig_Man_t *pPart0;
  char pFileName1 [1000];
  char pFileName0 [1000];
  
  iVar3 = 1;
  pAVar4 = pNtk;
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    Abc_Print((int)pAVar4,"Converting network into AIG has failed.\n");
    iVar3 = 0;
  }
  else {
    iVar1 = Saig_ManDemiterSimpleDiff(p,&pPart0,&pPart1);
    if (iVar1 == 0) {
      Aig_ManStop(p);
      iVar3 = 0;
      Abc_Print((int)p,"Demitering has failed.\n");
    }
    else {
      pcVar2 = pNtk->pSpec;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = pNtk->pName;
      }
      pcVar2 = Extra_FileNameGeneric(pcVar2);
      builtin_strncpy(pFileName0,"part0.aig",10);
      builtin_strncpy(pFileName1,"part1.aig",10);
      free(pcVar2);
      Ioa_WriteAiger(pPart0,pFileName0,0,0);
      pAVar5 = pPart1;
      Ioa_WriteAiger(pPart1,pFileName1,0,0);
      Abc_Print((int)pAVar5,"Demitering produced two files \"%s\" and \"%s\".\n",pFileName0,
                pFileName1);
      Aig_ManStop(pPart0);
      Aig_ManStop(pPart1);
      Aig_ManStop(p);
    }
  }
  return iVar3;
}

Assistant:

int Abc_NtkDarDemiter( Abc_Ntk_t * pNtk )
{ 
    char * pFileNameGeneric, pFileName0[1000], pFileName1[1000];
    Aig_Man_t * pMan, * pPart0, * pPart1;//, * pMiter;
    // derive the AIG manager
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting network into AIG has failed.\n" );
        return 0;
    }
//    if ( !Saig_ManDemiterSimple( pMan, &pPart0, &pPart1 ) )
    if ( !Saig_ManDemiterSimpleDiff( pMan, &pPart0, &pPart1 ) )
    {
        Aig_ManStop( pMan );
        Abc_Print( 1, "Demitering has failed.\n" );
        return 0;
    }
    // create file names
    pFileNameGeneric = Extra_FileNameGeneric( pNtk->pSpec ? pNtk->pSpec : pNtk->pName );
//    sprintf( pFileName0,  "%s%s",  pFileNameGeneric, "_part0.aig" ); 
//    sprintf( pFileName1,  "%s%s",  pFileNameGeneric, "_part1.aig" ); 
    sprintf( pFileName0,  "%s",  "part0.aig" ); 
    sprintf( pFileName1,  "%s",  "part1.aig" ); 
    ABC_FREE( pFileNameGeneric );
    // dump files
    Ioa_WriteAiger( pPart0, pFileName0, 0, 0 );
    Ioa_WriteAiger( pPart1, pFileName1, 0, 0 );
    Abc_Print( 1, "Demitering produced two files \"%s\" and \"%s\".\n", pFileName0, pFileName1 );
    // create two-level miter
//    pMiter = Saig_ManCreateMiterTwo( pPart0, pPart1, 2 );
//    Aig_ManDumpBlif( pMiter, "miter01.blif", NULL, NULL );
//    Aig_ManStop( pMiter );
//    Abc_Print( 1, "The new miter is written into file \"%s\".\n", "miter01.blif" );
    Aig_ManStop( pPart0 );
    Aig_ManStop( pPart1 );
    Aig_ManStop( pMan );
    return 1;
}